

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O1

void bio_write(opj_bio_t *bio,int v,int n)

{
  uint uVar1;
  uchar *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  
  if (0 < n) {
    iVar5 = n + 1;
    do {
      if (bio->ct == 0) {
        uVar1 = bio->buf;
        uVar3 = uVar1 & 0xff;
        bio->buf = uVar3 << 8;
        bio->ct = (uVar3 != 0xff) + 7;
        puVar2 = bio->bp;
        if (puVar2 < bio->end) {
          bio->bp = puVar2 + 1;
          *puVar2 = (uchar)uVar1;
        }
      }
      iVar4 = bio->ct + -1;
      bio->ct = iVar4;
      bio->buf = bio->buf |
                 (uint)(((uint)v >> (iVar5 - 2U & 0x1f) & 1) != 0) << ((byte)iVar4 & 0x1f);
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  return;
}

Assistant:

void bio_write(opj_bio_t *bio, int v, int n) {
	int i;
	for (i = n - 1; i >= 0; i--) {
		bio_putbit(bio, (v >> i) & 1);
	}
}